

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O3

SRes WaitId(CSzData *sd,UInt32 id)

{
  SRes SVar1;
  ulong in_RAX;
  UInt64 type;
  ulong local_28;
  
  local_28 = in_RAX;
  SVar1 = ReadNumber(sd,&local_28);
  if (SVar1 == 0) {
    while( true ) {
      if (local_28 == id) {
        return 0;
      }
      if (local_28 == 0) break;
      SVar1 = SkipData(sd);
      if (SVar1 != 0) {
        return SVar1;
      }
      SVar1 = ReadNumber(sd,&local_28);
      if (SVar1 != 0) {
        return SVar1;
      }
    }
    SVar1 = 0x10;
  }
  return SVar1;
}

Assistant:

static SRes WaitId(CSzData *sd, UInt32 id)
{
  for (;;)
  {
    UInt64 type;
    RINOK(ReadID(sd, &type));
    if (type == id)
      return SZ_OK;
    if (type == k7zIdEnd)
      return SZ_ERROR_ARCHIVE;
    RINOK(SkipData(sd));
  }
}